

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

const_iterator * __thiscall
QMultiHash<QString,_QCss::StyleRule>::constFindImpl<QString>
          (QMultiHash<QString,_QCss::StyleRule> *this,QString *key)

{
  long lVar1;
  piter it_00;
  bool bVar2;
  Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *in_RSI;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  Bucket it;
  Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_> *in_stack_ffffffffffffffa8;
  const_iterator *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = isEmpty((QMultiHash<QString,_QCss::StyleRule> *)in_RSI);
  if (bVar2) {
    end((QMultiHash<QString,_QCss::StyleRule> *)in_RDI);
  }
  else {
    QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_>::findBucket<QString>
              (in_RSI,(QString *)this_00);
    bVar2 = QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_>::Bucket::isUnused
                      ((Bucket *)0xa4ba31);
    if (bVar2) {
      constEnd((QMultiHash<QString,_QCss::StyleRule> *)in_RDI);
    }
    else {
      iVar3 = QHashPrivate::Data<QHashPrivate::MultiNode<QString,_QCss::StyleRule>_>::Bucket::
              toIterator((Bucket *)in_RDI,in_stack_ffffffffffffffa8);
      it_00.bucket = (size_t)iVar3.d;
      it_00.d = in_RSI;
      const_iterator::const_iterator(this_00,it_00,(Chain **)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

const_iterator constFindImpl(const K &key) const noexcept
    {
        if (isEmpty())
            return end();
        auto it = d->findBucket(key);
        if (it.isUnused())
            return constEnd();
        return const_iterator(it.toIterator(d));
    }